

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmatrix.cpp
# Opt level: O3

int __thiscall
TPZMatrix<std::complex<long_double>_>::Decompose_Cholesky
          (TPZMatrix<std::complex<long_double>_> *this,list<long,_std::allocator<long>_> *singular)

{
  size_t *psVar1;
  list<long,_std::allocator<long>_> *plVar2;
  char cVar3;
  int iVar4;
  int extraout_var;
  _List_node_base *p_Var5;
  undefined8 in_R8;
  undefined8 in_R9;
  _List_node_base *p_Var6;
  undefined1 *puVar7;
  longdouble in_ST0;
  longdouble lVar8;
  longdouble in_ST1;
  longdouble lVar9;
  longdouble lVar10;
  longdouble in_ST2;
  longdouble lVar11;
  longdouble in_ST3;
  longdouble in_ST4;
  longdouble in_ST5;
  complex<long_double> __r_1;
  complex<long_double> __r;
  complex<long_double> __r_2;
  complex<long_double> tmp;
  undefined4 uVar12;
  undefined2 uVar13;
  undefined4 uVar14;
  undefined2 uVar15;
  unkbyte10 Var16;
  unkbyte10 Var17;
  undefined4 local_158;
  undefined4 uStack_154;
  undefined2 uStack_150;
  undefined2 uStack_14e;
  undefined4 uStack_14c;
  undefined4 local_148;
  undefined4 uStack_144;
  undefined2 uStack_140;
  undefined2 uStack_13e;
  undefined4 uStack_13c;
  longdouble local_130;
  _List_node_base *local_120;
  complex<long_double> local_118;
  complex<long_double> local_f8;
  list<long,_std::allocator<long>_> *local_d8;
  longdouble local_d0;
  longdouble local_c4;
  undefined4 local_b8;
  undefined4 uStack_b4;
  undefined2 uStack_b0;
  undefined2 uStack_ae;
  undefined4 uStack_ac;
  undefined4 local_a8;
  undefined4 uStack_a4;
  undefined2 uStack_a0;
  undefined2 uStack_9e;
  undefined4 uStack_9c;
  complex<long_double> local_98;
  undefined1 local_78 [32];
  complex<long_double> local_58;
  
  cVar3 = (this->super_TPZBaseMatrix).fDecomposed;
  local_d8 = singular;
  if ((cVar3 != '\0') && (cVar3 != '\x03')) {
    Error("Decompose_Cholesky <Matrix already Decomposed>",(char *)0x0);
    cVar3 = (this->super_TPZBaseMatrix).fDecomposed;
  }
  if (cVar3 == '\0') {
    if ((this->super_TPZBaseMatrix).fRow != (this->super_TPZBaseMatrix).fCol) {
      Error("Decompose_Cholesky <Matrix must be square>",(char *)0x0);
    }
    iVar4 = (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0xc])(this);
    local_120 = (_List_node_base *)CONCAT44(extraout_var,iVar4);
    if (local_120 != (_List_node_base *)0x0 && -1 < extraout_var) {
      local_d0 = (longdouble)1e-12;
      local_c4 = (longdouble)1e-16;
      p_Var6 = (_List_node_base *)0x0;
      do {
        lVar8 = in_ST2;
        lVar10 = in_ST3;
        if (p_Var6 != (_List_node_base *)0x0) {
          p_Var5 = (_List_node_base *)0x0;
          do {
            (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])
                      (&local_b8,this,p_Var6,p_Var6);
            (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])
                      (&local_f8,this,p_Var6,p_Var5);
            (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])
                      (&local_98,this,p_Var6,p_Var5);
            local_118._M_value._16_4_ = local_f8._M_value._16_4_;
            local_118._M_value._20_4_ = local_f8._M_value._20_4_;
            local_118._M_value._24_2_ = local_f8._M_value._24_2_;
            local_118._M_value._26_2_ = local_f8._M_value._26_2_;
            local_118._M_value._28_4_ = local_f8._M_value._28_4_;
            local_118._M_value._0_4_ = local_f8._M_value._0_4_;
            local_118._M_value._4_4_ = local_f8._M_value._4_4_;
            local_118._M_value._8_2_ = local_f8._M_value._8_2_;
            local_118._M_value._10_2_ = local_f8._M_value._10_2_;
            local_118._M_value._12_4_ = local_f8._M_value._12_4_;
            std::complex<long_double>::operator*=(&local_118,&local_98);
            uStack_14e = uStack_ae;
            uStack_14c = uStack_ac;
            uStack_13e = uStack_9e;
            uStack_13c = uStack_9c;
            lVar11 = (longdouble)CONCAT28(uStack_b0,CONCAT44(uStack_b4,local_b8)) -
                     (longdouble)
                     CONCAT28(local_118._M_value._8_2_,
                              CONCAT44(local_118._M_value._4_4_,local_118._M_value._0_4_));
            lVar9 = (longdouble)CONCAT28(uStack_a0,CONCAT44(uStack_a4,local_a8)) -
                    (longdouble)
                    CONCAT28(local_118._M_value._24_2_,
                             CONCAT44(local_118._M_value._20_4_,local_118._M_value._16_4_));
            local_158 = SUB104(lVar11,0);
            uStack_154 = (undefined4)((unkuint10)lVar11 >> 0x20);
            uStack_150 = (undefined2)((unkuint10)lVar11 >> 0x40);
            local_148 = SUB104(lVar9,0);
            uStack_144 = (undefined4)((unkuint10)lVar9 >> 0x20);
            uStack_140 = (undefined2)((unkuint10)lVar9 >> 0x40);
            in_ST5 = in_ST4;
            (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x23])
                      (this,p_Var6,p_Var6,&local_158);
            p_Var5 = (_List_node_base *)((long)&p_Var5->_M_next + 1);
          } while (p_Var6 != p_Var5);
        }
        (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])
                  (local_78,this,p_Var6,p_Var6);
        local_158 = (undefined4)local_78._0_10_;
        uStack_154 = SUB104(local_78._0_10_,4);
        uStack_150 = SUB102(local_78._0_10_,8);
        local_148 = (undefined4)local_78._16_10_;
        uStack_144 = SUB104(local_78._16_10_,4);
        uStack_140 = SUB102(local_78._16_10_,8);
        in_ST2 = in_ST5;
        in_ST3 = in_ST5;
        cabsl();
        local_130 = ABS(in_ST0);
        local_158 = SUB104(local_d0,0);
        uStack_154 = (undefined4)((unkuint10)local_d0 >> 0x20);
        uStack_150 = (undefined2)((unkuint10)local_d0 >> 0x40);
        lVar9 = (longdouble)0;
        local_148 = SUB104(lVar9,0);
        uStack_144 = (undefined4)((unkuint10)lVar9 >> 0x20);
        uStack_140 = (undefined2)((unkuint10)lVar9 >> 0x40);
        in_ST0 = in_ST4;
        uVar12 = local_158;
        uVar13 = uStack_150;
        uVar14 = local_148;
        uVar15 = uStack_140;
        cabsl();
        lVar9 = ABS(in_ST1);
        in_ST1 = in_ST5;
        if (local_130 <= lVar9) {
          p_Var5 = (_List_node_base *)operator_new(0x18);
          plVar2 = local_d8;
          p_Var5[1]._M_next = p_Var6;
          std::__detail::_List_node_base::_M_hook(p_Var5);
          psVar1 = &(plVar2->super__List_base<long,_std::allocator<long>_>)._M_impl._M_node._M_size;
          *psVar1 = *psVar1 + 1;
          lVar9 = (longdouble)1;
          local_158 = SUB104(lVar9,0);
          uStack_154 = (undefined4)((unkuint10)lVar9 >> 0x20);
          uStack_150 = (undefined2)((unkuint10)lVar9 >> 0x40);
          lVar9 = (longdouble)0;
          local_148 = SUB104(lVar9,0);
          uStack_144 = (undefined4)((unkuint10)lVar9 >> 0x20);
          uStack_140 = (undefined2)((unkuint10)lVar9 >> 0x40);
          (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x23])
                    (this,p_Var6,p_Var6,&local_158,in_R8,in_R9,uVar12,uVar13,uVar14,uVar15);
          in_ST1 = in_ST5;
        }
        (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])
                  (&local_118,this,p_Var6,p_Var6);
        local_158 = local_118._M_value._0_4_;
        uStack_154 = local_118._M_value._4_4_;
        uStack_150 = local_118._M_value._8_2_;
        local_148 = local_118._M_value._16_4_;
        uStack_144 = local_118._M_value._20_4_;
        uStack_140 = local_118._M_value._24_2_;
        in_ST4 = in_ST3;
        in_ST5 = in_ST3;
        uVar12 = local_118._M_value._0_4_;
        uVar13 = local_118._M_value._8_2_;
        uVar14 = local_118._M_value._16_4_;
        uVar15 = local_118._M_value._24_2_;
        csqrtl();
        local_b8 = SUB104(lVar8,0);
        uStack_b4 = (undefined4)((unkuint10)lVar8 >> 0x20);
        uStack_b0 = (undefined2)((unkuint10)lVar8 >> 0x40);
        local_a8 = SUB104(lVar10,0);
        uStack_a4 = (undefined4)((unkuint10)lVar10 >> 0x20);
        uStack_a0 = (undefined2)((unkuint10)lVar10 >> 0x40);
        (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x23])
                  (this,p_Var6,p_Var6,&local_b8,in_R8,in_R9,uVar12,uVar13,uVar14,uVar15);
        puVar7 = (undefined1 *)((long)&p_Var6->_M_next + 1);
        local_130 = (longdouble)CONCAT28(local_130._8_2_,puVar7);
        if ((long)puVar7 < (long)local_120) {
          do {
            lVar8 = in_ST1;
            lVar10 = in_ST2;
            if (p_Var6 != (_List_node_base *)0x0) {
              p_Var5 = (_List_node_base *)0x0;
              do {
                (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])
                          (&local_118,this,p_Var6,puVar7);
                (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])
                          (&local_98,this,p_Var6,p_Var5);
                (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])
                          (&local_58,this,p_Var5,puVar7);
                local_f8._M_value._16_4_ = local_98._M_value._16_4_;
                local_f8._M_value._20_4_ = local_98._M_value._20_4_;
                local_f8._M_value._24_2_ = local_98._M_value._24_2_;
                local_f8._M_value._26_2_ = local_98._M_value._26_2_;
                local_f8._M_value._28_4_ = local_98._M_value._28_4_;
                local_f8._M_value._0_4_ = local_98._M_value._0_4_;
                local_f8._M_value._4_4_ = local_98._M_value._4_4_;
                local_f8._M_value._8_2_ = local_98._M_value._8_2_;
                local_f8._M_value._10_2_ = local_98._M_value._10_2_;
                local_f8._M_value._12_4_ = local_98._M_value._12_4_;
                std::complex<long_double>::operator*=(&local_f8,&local_58);
                uStack_14e = local_118._M_value._10_2_;
                uStack_14c = local_118._M_value._12_4_;
                uStack_13e = local_118._M_value._26_2_;
                uStack_13c = local_118._M_value._28_4_;
                lVar11 = (longdouble)
                         CONCAT28(local_118._M_value._8_2_,
                                  CONCAT44(local_118._M_value._4_4_,local_118._M_value._0_4_)) -
                         (longdouble)
                         CONCAT28(local_f8._M_value._8_2_,
                                  CONCAT44(local_f8._M_value._4_4_,local_f8._M_value._0_4_));
                lVar9 = (longdouble)
                        CONCAT28(local_118._M_value._24_2_,
                                 CONCAT44(local_118._M_value._20_4_,local_118._M_value._16_4_)) -
                        (longdouble)
                        CONCAT28(local_f8._M_value._24_2_,
                                 CONCAT44(local_f8._M_value._20_4_,local_f8._M_value._16_4_));
                local_158 = SUB104(lVar11,0);
                uStack_154 = (undefined4)((unkuint10)lVar11 >> 0x20);
                uStack_150 = (undefined2)((unkuint10)lVar11 >> 0x40);
                local_148 = SUB104(lVar9,0);
                uStack_144 = (undefined4)((unkuint10)lVar9 >> 0x20);
                uStack_140 = (undefined2)((unkuint10)lVar9 >> 0x40);
                (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x23])
                          (this,p_Var6,puVar7,&local_158);
                p_Var5 = (_List_node_base *)((long)&p_Var5->_M_next + 1);
              } while (p_Var6 != p_Var5);
            }
            in_ST1 = in_ST4;
            (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])
                      (&local_118,this,p_Var6,p_Var6);
            local_158 = local_118._M_value._0_4_;
            uStack_154 = local_118._M_value._4_4_;
            local_148 = local_118._M_value._16_4_;
            uStack_144 = local_118._M_value._20_4_;
            uVar12 = local_118._M_value._0_4_;
            uVar13 = local_118._M_value._8_2_;
            uVar14 = local_118._M_value._16_4_;
            uVar15 = local_118._M_value._24_2_;
            cabsl();
            lVar9 = ABS(in_ST0);
            in_ST0 = in_ST3;
            if (lVar9 < local_c4) {
              Error("Decompose_Cholesky <Zero on diagonal>",(char *)0x0);
              in_ST0 = in_ST3;
            }
            (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])
                      (&local_f8,this,p_Var6,puVar7,in_R8,in_R9,uVar12,uVar13,uVar14,uVar15);
            (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])
                      (&local_98,this,p_Var6,p_Var6);
            local_158 = local_f8._M_value._0_4_;
            uStack_154 = local_f8._M_value._4_4_;
            uStack_14e = local_f8._M_value._10_2_;
            uStack_14c = local_f8._M_value._12_4_;
            local_148 = local_f8._M_value._16_4_;
            uStack_144 = local_f8._M_value._20_4_;
            uStack_13e = local_f8._M_value._26_2_;
            uStack_13c = local_f8._M_value._28_4_;
            Var16 = CONCAT28(local_98._M_value._8_2_,local_98._M_value._0_8_);
            Var17 = CONCAT28(local_98._M_value._24_2_,local_98._M_value._16_8_);
            in_ST2 = in_ST1;
            in_ST3 = in_ST1;
            in_ST4 = in_ST1;
            in_ST5 = in_ST1;
            uVar12 = local_f8._M_value._0_4_;
            uVar13 = local_f8._M_value._8_2_;
            uVar14 = local_f8._M_value._16_4_;
            uVar15 = local_f8._M_value._24_2_;
            __divxc3();
            local_158 = SUB104(lVar8,0);
            uStack_154 = (undefined4)((unkuint10)lVar8 >> 0x20);
            uStack_150 = (undefined2)((unkuint10)lVar8 >> 0x40);
            local_148 = SUB104(lVar10,0);
            uStack_144 = (undefined4)((unkuint10)lVar10 >> 0x20);
            uStack_140 = (undefined2)((unkuint10)lVar10 >> 0x40);
            (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x23])
                      (this,p_Var6,puVar7,&local_158,in_R8,in_R9,uVar12,uVar13,uVar14,uVar15,Var16,
                       Var17);
            (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])
                      (&local_158,this,p_Var6,puVar7);
            (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x23])
                      (this,puVar7,p_Var6,&local_158);
            puVar7 = puVar7 + 1;
          } while ((long)puVar7 < (long)local_120);
        }
        p_Var6 = local_130._0_8_;
      } while (local_130._0_8_ != local_120);
    }
    (this->super_TPZBaseMatrix).fDecomposed = '\x03';
  }
  return 3;
}

Assistant:

int TPZMatrix<TVar>::Decompose_Cholesky(std::list<int64_t> &singular) {
	if (  fDecomposed && fDecomposed != ECholesky) Error( "Decompose_Cholesky <Matrix already Decomposed>" );
	if (  fDecomposed ) return ECholesky;
	if ( Rows()!=Cols() ) Error( "Decompose_Cholesky <Matrix must be square>" );
	//return 0;
	
	int64_t dim=Dim();
	for (int64_t i=0 ; i<dim; i++) {
		for(int64_t k=0; k<i; k++) {             //elementos da diagonal
			PutVal( i,i,GetVal(i,i)-GetVal(i,k)*GetVal(i,k) );
		}
		if((fabs(GetVal(i,i))) <= fabs((TVar)1.e-12))
		{
			singular.push_back(i);
			PutVal(i,i,1.);
		}
		TVar tmp = sqrt(GetVal(i,i));
        PutVal( i,i,tmp );
        for (int64_t j=i+1;j<dim; j++) {           //elementos fora da diagonal
            for(int64_t k=0; k<i; k++) {
                PutVal( i,j,GetVal(i,j)-GetVal(i,k)*GetVal(k,j) );
            }
            TVar tmp2 = GetVal(i,i);
            if ( IsZero(tmp2) ) {
				Error( "Decompose_Cholesky <Zero on diagonal>" );
            }
            PutVal(i,j,GetVal(i,j)/GetVal(i,i) );
            PutVal(j,i,GetVal(i,j));
			
        }
    }
	fDecomposed = ECholesky;
	return ECholesky;
}